

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O1

void Cmd_loopsound(FCommandLine *argv,APlayerPawn *who,int key)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  PClassActor *type;
  AActor *ent;
  FSoundID local_40;
  FName local_3c;
  DVector3 local_38;
  
  if (((&players)[(long)consoleplayer * 0x54] != 0) && (!netgame)) {
    iVar2 = FCommandLine::argc(argv);
    if (1 < iVar2) {
      pcVar3 = FCommandLine::operator[](argv,1);
      iVar2 = S_FindSound(pcVar3);
      if (iVar2 == 0) {
        pcVar3 = FCommandLine::operator[](argv,1);
        Printf("\'%s\' is not a sound\n",pcVar3);
        return;
      }
      local_3c.Index = FName::NameManager::FindName(&FName::NameData,"SpeakerIcon",false);
      lVar1 = (&players)[(long)consoleplayer * 0x54];
      local_38.X = *(double *)(lVar1 + 0x48);
      local_38.Y = *(double *)(lVar1 + 0x50);
      local_38.Z = *(double *)(lVar1 + 0x58) + 32.0;
      type = ClassForSpawn(&local_3c);
      ent = AActor::StaticSpawn(type,&local_38,ALLOW_REPLACE,false);
      if (ent != (AActor *)0x0) {
        local_40.ID = iVar2;
        S_Sound(ent,0x104,&local_40,1.0,1.001);
      }
    }
  }
  return;
}

Assistant:

CCMD (loopsound)
{
	if (players[consoleplayer].mo != NULL && !netgame && argv.argc() > 1)
	{
		FSoundID id = argv[1];
		if (id == 0)
		{
			Printf("'%s' is not a sound\n", argv[1]);
		}
		else
		{
			AActor *icon = Spawn("SpeakerIcon", players[consoleplayer].mo->PosPlusZ(32.), ALLOW_REPLACE);
			if (icon != NULL)
			{
				S_Sound(icon, CHAN_BODY | CHAN_LOOP, id, 1.f, ATTN_IDLE);
			}
		}
	}
}